

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tags.hpp
# Opt level: O0

IfTag * __thiscall Qentem::Tags::TagBit::MakeIfTag(TagBit *this)

{
  IfTag *pIVar1;
  IfTag *tag;
  TagBit *this_local;
  
  pIVar1 = Memory::AllocateInit<Qentem::Tags::IfTag>();
  this->type_ = If;
  this->storage_ = pIVar1;
  return pIVar1;
}

Assistant:

IfTag *MakeIfTag() {
        IfTag *tag = Memory::AllocateInit<IfTag>();

        type_    = TagType::If;
        storage_ = tag;

        return tag;
    }